

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O1

void __thiscall
slang::ast::AssertionInstanceExpression::visitExprs<LookupIdentifier&>
          (AssertionInstanceExpression *this,LookupIdentifier *visitor)

{
  size_t sVar1;
  pointer ppSVar2;
  DeclaredType *this_00;
  Expression *this_01;
  long lVar3;
  
  AssertionExpr::visit<LookupIdentifier>(this->body,visitor);
  sVar1 = (this->localVars)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppSVar2 = (this->localVars)._M_ptr;
    lVar3 = 0;
    do {
      this_00 = Symbol::getDeclaredType(*(Symbol **)((long)ppSVar2 + lVar3));
      this_01 = DeclaredType::getInitializer(this_00);
      if (this_01 != (Expression *)0x0) {
        Expression::visitExpression<slang::ast::Expression_const,LookupIdentifier&>
                  (this_01,this_01,visitor);
      }
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        body.visit(visitor);
        for (auto sym : localVars) {
            auto dt = sym->getDeclaredType();
            SLANG_ASSERT(dt);
            if (auto init = dt->getInitializer())
                init->visit(visitor);
        }
    }